

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::RequestBuilder::Execute(RequestBuilder *this)

{
  Worker *this_00;
  unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> local_18;
  RequestBuilder *local_10;
  RequestBuilder *this_local;
  
  local_10 = this;
  Build(this);
  this_00 = this->worker_;
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::unique_ptr
            (&local_18,&this->request_);
  Worker::Enqueue(this_00,&local_18);
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

void Execute() {
            Build();
            worker_.Enqueue(std::move(request_));
        }